

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O2

upb_FileDef * upb_DefPool_FindFileContainingSymbol(upb_DefPool *s,char *name)

{
  _Bool _Var1;
  upb_deftype_t uVar2;
  upb_FieldDef *f;
  char *pcVar3;
  upb_MessageDef *m;
  size_t len;
  upb_ServiceDef *s_00;
  upb_EnumValueDef *v_00;
  upb_EnumDef *e;
  upb_FileDef *puVar4;
  upb_value v;
  
  _Var1 = upb_strtable_lookup(&s->syms,name,&v);
  if (_Var1) {
    uVar2 = _upb_DefType_Type(v);
    switch(uVar2) {
    case UPB_DEFTYPE_EXT:
      f = (upb_FieldDef *)_upb_DefType_Unpack(v,UPB_DEFTYPE_EXT);
      puVar4 = upb_FieldDef_File(f);
      return puVar4;
    case UPB_DEFTYPE_MSG:
      m = (upb_MessageDef *)_upb_DefType_Unpack(v,UPB_DEFTYPE_MSG);
      goto LAB_002ae201;
    case UPB_DEFTYPE_ENUM:
      e = (upb_EnumDef *)_upb_DefType_Unpack(v,UPB_DEFTYPE_ENUM);
      break;
    case UPB_DEFTYPE_ENUMVAL:
      v_00 = (upb_EnumValueDef *)_upb_DefType_Unpack(v,UPB_DEFTYPE_ENUMVAL);
      e = upb_EnumValueDef_Enum(v_00);
      break;
    case UPB_DEFTYPE_SERVICE:
      s_00 = (upb_ServiceDef *)_upb_DefType_Unpack(v,UPB_DEFTYPE_SERVICE);
      puVar4 = upb_ServiceDef_File(s_00);
      return puVar4;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/reflection/def_pool.c"
                    ,0x12d,
                    "const upb_FileDef *upb_DefPool_FindFileContainingSymbol(const upb_DefPool *, const char *)"
                   );
    }
    puVar4 = upb_EnumDef_File(e);
    return puVar4;
  }
  pcVar3 = strrchr(name,0x2e);
  if ((pcVar3 == (char *)0x0) ||
     (m = upb_DefPool_FindMessageByNameWithSize(s,name,(long)pcVar3 - (long)name),
     m == (upb_MessageDef *)0x0)) {
    return (upb_FileDef *)0x0;
  }
  len = strlen(pcVar3 + 1);
  _Var1 = upb_MessageDef_FindByNameWithSize
                    (m,pcVar3 + 1,len,(upb_FieldDef **)0x0,(upb_OneofDef **)0x0);
  if (!_Var1) {
    return (upb_FileDef *)0x0;
  }
LAB_002ae201:
  puVar4 = upb_MessageDef_File(m);
  return puVar4;
}

Assistant:

const upb_FileDef* upb_DefPool_FindFileContainingSymbol(const upb_DefPool* s,
                                                        const char* name) {
  upb_value v;
  // TODO: non-extension fields and oneofs.
  if (upb_strtable_lookup(&s->syms, name, &v)) {
    switch (_upb_DefType_Type(v)) {
      case UPB_DEFTYPE_EXT: {
        const upb_FieldDef* f = _upb_DefType_Unpack(v, UPB_DEFTYPE_EXT);
        return upb_FieldDef_File(f);
      }
      case UPB_DEFTYPE_MSG: {
        const upb_MessageDef* m = _upb_DefType_Unpack(v, UPB_DEFTYPE_MSG);
        return upb_MessageDef_File(m);
      }
      case UPB_DEFTYPE_ENUM: {
        const upb_EnumDef* e = _upb_DefType_Unpack(v, UPB_DEFTYPE_ENUM);
        return upb_EnumDef_File(e);
      }
      case UPB_DEFTYPE_ENUMVAL: {
        const upb_EnumValueDef* ev =
            _upb_DefType_Unpack(v, UPB_DEFTYPE_ENUMVAL);
        return upb_EnumDef_File(upb_EnumValueDef_Enum(ev));
      }
      case UPB_DEFTYPE_SERVICE: {
        const upb_ServiceDef* service =
            _upb_DefType_Unpack(v, UPB_DEFTYPE_SERVICE);
        return upb_ServiceDef_File(service);
      }
      default:
        UPB_UNREACHABLE();
    }
  }

  const char* last_dot = strrchr(name, '.');
  if (last_dot) {
    const upb_MessageDef* parent =
        upb_DefPool_FindMessageByNameWithSize(s, name, last_dot - name);
    if (parent) {
      const char* shortname = last_dot + 1;
      if (upb_MessageDef_FindByNameWithSize(parent, shortname,
                                            strlen(shortname), NULL, NULL)) {
        return upb_MessageDef_File(parent);
      }
    }
  }

  return NULL;
}